

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3auxColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  int iVar1;
  sqlite3_module *iVal;
  _func_void_void_ptr *xDel;
  sqlite3_vtab *z;
  
  switch(iCol) {
  case 0:
    z = pCursor[8].pVtab;
    iVar1 = *(int *)&pCursor[9].pVtab;
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    break;
  case 1:
    if (*(int *)&pCursor[0x13].pVtab != 0) {
      iVar1 = *(int *)&pCursor[0x13].pVtab + -1;
      goto LAB_0019e3f4;
    }
    iVar1 = -1;
    z = (sqlite3_vtab *)0x1c9c46;
    xDel = (_func_void_void_ptr *)0x0;
    break;
  case 2:
    iVal = (&(pCursor[0x14].pVtab)->pModule)[(long)*(int *)&pCursor[0x13].pVtab * 2];
    goto LAB_0019e3d3;
  case 3:
    iVal = *(sqlite3_module **)
            (&(pCursor[0x14].pVtab)->nRef + (long)*(int *)&pCursor[0x13].pVtab * 4);
LAB_0019e3d3:
    sqlite3_result_int64(pCtx,(i64)iVal);
    return 0;
  default:
    iVar1 = *(int *)((long)&pCursor[0x10].pVtab + 4);
LAB_0019e3f4:
    sqlite3_result_int(pCtx,iVar1);
    return 0;
  }
  sqlite3_result_text(pCtx,(char *)z,iVar1,xDel);
  return 0;
}

Assistant:

static int fts3auxColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts3auxCursor *p = (Fts3auxCursor *)pCursor;

  assert( p->isEof==0 );
  switch( iCol ){
    case 0: /* term */
      sqlite3_result_text(pCtx, p->csr.zTerm, p->csr.nTerm, SQLITE_TRANSIENT);
      break;

    case 1: /* col */
      if( p->iCol ){
        sqlite3_result_int(pCtx, p->iCol-1);
      }else{
        sqlite3_result_text(pCtx, "*", -1, SQLITE_STATIC);
      }
      break;

    case 2: /* documents */
      sqlite3_result_int64(pCtx, p->aStat[p->iCol].nDoc);
      break;

    case 3: /* occurrences */
      sqlite3_result_int64(pCtx, p->aStat[p->iCol].nOcc);
      break;

    default: /* languageid */
      assert( iCol==4 );
      sqlite3_result_int(pCtx, p->iLangid);
      break;
  }

  return SQLITE_OK;
}